

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

void Bac_ObjSetFanin(Bac_Ntk_t *p,int i,int x)

{
  int iVar1;
  int x_local;
  int i_local;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_ObjFanin(p,i);
  if (iVar1 == -1) {
    iVar1 = Bac_ObjIsCo(p,i);
    if (iVar1 != 0) {
      Vec_IntSetEntry(&p->vFanin,i,x);
      return;
    }
  }
  __assert_fail("Bac_ObjFanin(p, i) == -1 && Bac_ObjIsCo(p, i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                ,0x12a,"void Bac_ObjSetFanin(Bac_Ntk_t *, int, int)");
}

Assistant:

static inline void           Bac_ObjSetFanin( Bac_Ntk_t * p, int i, int x )  { assert(Bac_ObjFanin(p, i) == -1 && Bac_ObjIsCo(p, i)); Vec_IntSetEntry( &p->vFanin, i, x);  }